

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall
S2Polygon::InitOriented
          (S2Polygon *this,
          vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
          *loops)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  reference this_00;
  S2Loop *pSVar7;
  size_type sVar8;
  ostream *poVar9;
  double dVar10;
  double dVar11;
  pair<std::_Rb_tree_const_iterator<const_S2Loop_*>,_bool> pVar12;
  S2LogMessage local_d0;
  S2LogMessageVoidify local_b9;
  S2Loop *local_b8;
  int local_ac;
  int local_a8;
  int i_2;
  int i_1;
  bool polygon_contains_origin;
  S2Loop *origin_loop;
  double local_80;
  double angle;
  undefined1 local_70;
  pointer local_58;
  S2Loop *loop;
  undefined1 local_48 [4];
  int i;
  set<const_S2Loop_*,_std::less<const_S2Loop_*>,_std::allocator<const_S2Loop_*>_> contained_origin;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  *loops_local;
  S2Polygon *this_local;
  
  contained_origin._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)loops;
  std::set<const_S2Loop_*,_std::less<const_S2Loop_*>,_std::allocator<const_S2Loop_*>_>::set
            ((set<const_S2Loop_*,_std::less<const_S2Loop_*>,_std::allocator<const_S2Loop_*>_> *)
             local_48);
  for (loop._4_4_ = 0; uVar5 = (ulong)loop._4_4_,
      sVar6 = std::
              vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
              ::size(loops), uVar5 < sVar6; loop._4_4_ = loop._4_4_ + 1) {
    this_00 = std::
              vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
              ::operator[](loops,(long)loop._4_4_);
    local_58 = std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::get(this_00);
    bVar1 = S2Loop::contains_origin(local_58);
    if (bVar1) {
      pVar12 = std::set<const_S2Loop_*,_std::less<const_S2Loop_*>,_std::allocator<const_S2Loop_*>_>
               ::insert((set<const_S2Loop_*,_std::less<const_S2Loop_*>,_std::allocator<const_S2Loop_*>_>
                         *)local_48,&local_58);
      angle = (double)pVar12.first._M_node;
      local_70 = pVar12.second;
    }
    local_80 = S2Loop::GetCurvature(local_58);
    dVar10 = ABS(local_80);
    dVar11 = S2Loop::GetCurvatureMaxError(local_58);
    if (dVar10 <= dVar11) {
      bVar1 = S2Loop::contains_origin(local_58);
      if (bVar1) {
        S2Loop::Invert(local_58);
      }
    }
    else if (local_80 < 0.0) {
      S2Loop::Invert(local_58);
    }
  }
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::vector((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
            *)&origin_loop,loops);
  InitNested(this,(vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                   *)&origin_loop);
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::~vector((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
             *)&origin_loop);
  iVar3 = num_loops(this);
  if (0 < iVar3) {
    _i_1 = S2Polygon::loop(this,0);
    i_2._3_1_ = 0;
    for (local_a8 = 0; iVar3 = local_a8, iVar4 = num_loops(this), iVar3 < iVar4;
        local_a8 = local_a8 + 1) {
      pSVar7 = S2Polygon::loop(this,local_a8);
      bVar1 = S2Loop::contains_origin(pSVar7);
      if (bVar1) {
        i_2._3_1_ = ~i_2._3_1_ & 1;
        _i_1 = S2Polygon::loop(this,local_a8);
      }
    }
    sVar8 = std::set<const_S2Loop_*,_std::less<const_S2Loop_*>,_std::allocator<const_S2Loop_*>_>::
            count((set<const_S2Loop_*,_std::less<const_S2Loop_*>,_std::allocator<const_S2Loop_*>_> *
                  )local_48,(key_type *)&i_1);
    if (sVar8 != (i_2._3_1_ & 1)) {
      Invert(this);
    }
  }
  local_ac = 0;
  while( true ) {
    uVar5 = (ulong)local_ac;
    sVar6 = std::
            vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
            ::size(&this->loops_);
    if (sVar6 <= uVar5) {
      std::set<const_S2Loop_*,_std::less<const_S2Loop_*>,_std::allocator<const_S2Loop_*>_>::~set
                ((set<const_S2Loop_*,_std::less<const_S2Loop_*>,_std::allocator<const_S2Loop_*>_> *)
                 local_48);
      return;
    }
    local_b8 = S2Polygon::loop(this,local_ac);
    sVar8 = std::set<const_S2Loop_*,_std::less<const_S2Loop_*>,_std::allocator<const_S2Loop_*>_>::
            count((set<const_S2Loop_*,_std::less<const_S2Loop_*>,_std::allocator<const_S2Loop_*>_> *
                  )local_48,&local_b8);
    pSVar7 = S2Polygon::loop(this,local_ac);
    bVar1 = S2Loop::contains_origin(pSVar7);
    pSVar7 = S2Polygon::loop(this,local_ac);
    bVar2 = S2Loop::is_hole(pSVar7);
    if (((((sVar8 != bVar1) != bVar2) &&
         (this->error_inconsistent_loop_orientations_ = '\x01', (FLAGS_s2debug & 1U) != 0)) &&
        (this->s2debug_override_ == ALLOW)) && (bVar1 = IsValid(this), ((bVar1 ^ 0xffU) & 1) != 0))
    break;
    local_ac = local_ac + 1;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x1bf,kFatal,(ostream *)&std::cerr);
  poVar9 = S2LogMessage::stream(&local_d0);
  poVar9 = std::operator<<(poVar9,"Check failed: IsValid() ");
  S2LogMessageVoidify::operator&(&local_b9,poVar9);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_d0);
}

Assistant:

void S2Polygon::InitOriented(vector<unique_ptr<S2Loop>> loops) {
  // Here is the algorithm:
  //
  // 1. Remember which of the given loops contain S2::Origin().
  //
  // 2. Invert loops as necessary to ensure that they are nestable (i.e., no
  //    loop contains the complement of any other loop).  This may result in a
  //    set of loops corresponding to the complement of the given polygon, but
  //    we will fix that problem later.
  //
  //    We make the loops nestable by first normalizing all the loops (i.e.,
  //    inverting any loops whose curvature is negative).  This handles
  //    all loops except those whose curvature is very close to zero
  //    (within the maximum error tolerance).  Any such loops are inverted if
  //    and only if they contain S2::Origin().  (In theory this step is only
  //    necessary if there are at least two such loops.)  The resulting set of
  //    loops is guaranteed to be nestable.
  //
  // 3. Build the polygon.  This yields either the desired polygon or its
  //    complement.
  //
  // 4. If there is at least one loop, we find a loop L that is adjacent to
  //    S2::Origin() (where "adjacent" means that there exists a path
  //    connecting S2::Origin() to some vertex of L such that the path does
  //    not cross any loop).  There may be a single such adjacent loop, or
  //    there may be several (in which case they should all have the same
  //    contains_origin() value).  We choose L to be the loop containing the
  //    origin whose depth is greatest, or loop(0) (a top-level shell) if no
  //    such loop exists.
  //
  // 5. If (L originally contained origin) != (polygon contains origin), we
  //    invert the polygon.  This is done by inverting a top-level shell whose
  //    curvature is minimal and then fixing the nesting hierarchy.  Note
  //    that because we normalized all the loops initially, this step is only
  //    necessary if the polygon requires at least one non-normalized loop to
  //    represent it.

  set<const S2Loop*> contained_origin;
  for (int i = 0; i < loops.size(); ++i) {
    S2Loop* loop = loops[i].get();
    if (loop->contains_origin()) {
      contained_origin.insert(loop);
    }
    double angle = loop->GetCurvature();
    if (fabs(angle) > loop->GetCurvatureMaxError()) {
      // Normalize the loop.
      if (angle < 0) loop->Invert();
    } else {
      // Ensure that the loop does not contain the origin.
      if (loop->contains_origin()) loop->Invert();
    }
  }
  InitNested(std::move(loops));
  if (num_loops() > 0) {
    S2Loop* origin_loop = loop(0);
    bool polygon_contains_origin = false;
    for (int i = 0; i < num_loops(); ++i) {
      if (loop(i)->contains_origin()) {
        polygon_contains_origin ^= true;
        origin_loop = loop(i);
      }
    }
    if (contained_origin.count(origin_loop) != polygon_contains_origin) {
      Invert();
    }
  }
  // Verify that the original loops had consistent shell/hole orientations.
  // Each original loop L should have been inverted if and only if it now
  // represents a hole.
  for (int i = 0; i < loops_.size(); ++i) {
    if ((contained_origin.count(loop(i)) != loop(i)->contains_origin()) !=
        loop(i)->is_hole()) {
      // There is no point in saving the loop index, because the error is a
      // property of the entire set of loops.  In general there is no way to
      // determine which ones are incorrect.
      error_inconsistent_loop_orientations_ = true;
      if (FLAGS_s2debug && s2debug_override_ == S2Debug::ALLOW) {
        // The FLAGS_s2debug validity checking usually happens in InitIndex(),
        // but this error is detected too late for that.
        S2_CHECK(IsValid());  // Always fails.
      }
    }
  }
}